

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void fixToolBarOrientation(QLayoutItem *item,int dockPos)

{
  long lVar1;
  bool bVar2;
  Orientation OVar3;
  Orientation OVar4;
  LayoutDirection LVar5;
  QWidget *this;
  QSize this_00;
  QPoint this_01;
  int in_ESI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  Orientation o;
  DockPosition pos;
  QToolBar *toolBar;
  QRect newGeo;
  QSize hint;
  QRect oldGeo;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar6;
  Orientation OVar7;
  int pos_00;
  undefined4 in_stack_ffffffffffffff90;
  int iVar8;
  QRect *r;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)((long)*in_RDI + 0x68))();
  this = &qobject_cast<QToolBar*>((QObject *)0x5fa004)->super_QWidget;
  if (this != (QWidget *)0x0) {
    QWidget::geometry(this);
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
    if (in_ESI != 2) {
      uVar6 = CONCAT13(in_ESI == 3,(int3)in_stack_ffffffffffffff7c);
    }
    OVar3 = Vertical;
    if ((char)((uint)uVar6 >> 0x18) != '\0') {
      OVar3 = Horizontal;
    }
    OVar7 = OVar3;
    iVar8 = in_ESI;
    OVar4 = QToolBar::orientation((QToolBar *)CONCAT44(in_ESI,OVar3));
    if (OVar3 != OVar4) {
      QToolBar::setOrientation
                ((QToolBar *)CONCAT44(iVar8,in_stack_ffffffffffffff90),
                 (Orientation)((ulong)this >> 0x20));
    }
    (**(code **)(*(long *)this + 0x70))();
    QWidget::maximumSize((QWidget *)CONCAT44(iVar8,in_stack_ffffffffffffff90));
    QSize::boundedTo((QSize *)this,(QSize *)CONCAT44(in_ESI,OVar7));
    QWidget::minimumSize((QWidget *)CONCAT44(iVar8,in_stack_ffffffffffffff90));
    QSize::expandedTo((QSize *)this,(QSize *)CONCAT44(in_ESI,OVar7));
    pos_00 = (int)((ulong)this >> 0x20);
    this_00 = QWidget::size((QWidget *)CONCAT44(uVar6,OVar3));
    bVar2 = operator!=((QSize *)CONCAT44(in_ESI,OVar7),(QSize *)CONCAT44(uVar6,OVar3));
    if (bVar2) {
      r = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
      this_01 = QRect::topLeft((QRect *)CONCAT44(uVar6,OVar3));
      QRect::QRect((QRect *)this_01,in_RDI,(QSize *)CONCAT44(iVar8,in_stack_ffffffffffffff90));
      LVar5 = QWidget::layoutDirection((QWidget *)0x5fa175);
      if (LVar5 == RightToLeft) {
        QRect::right((QRect *)0x5fa184);
        QRect::moveRight((QRect *)CONCAT44(iVar8,in_stack_ffffffffffffff90),pos_00);
      }
      QWidget::setGeometry((QWidget *)this_00,r);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fixToolBarOrientation(QLayoutItem *item, int dockPos)
{
#if QT_CONFIG(toolbar)
    QToolBar *toolBar = qobject_cast<QToolBar*>(item->widget());
    if (toolBar == nullptr)
        return;

    QRect oldGeo = toolBar->geometry();

    QInternal::DockPosition pos
        = static_cast<QInternal::DockPosition>(dockPos);
    Qt::Orientation o = pos == QInternal::TopDock || pos == QInternal::BottomDock
                        ? Qt::Horizontal : Qt::Vertical;
    if (o != toolBar->orientation())
        toolBar->setOrientation(o);

    QSize hint = toolBar->sizeHint().boundedTo(toolBar->maximumSize())
                    .expandedTo(toolBar->minimumSize());

    if (toolBar->size() != hint) {
        QRect newGeo(oldGeo.topLeft(), hint);
        if (toolBar->layoutDirection() == Qt::RightToLeft)
            newGeo.moveRight(oldGeo.right());
        toolBar->setGeometry(newGeo);
    }

#else
    Q_UNUSED(item);
    Q_UNUSED(dockPos);
#endif
}